

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O0

void aes_schedule(cf_aes_context *ctx,uint8_t *key,size_t nkey)

{
  uint32_t uVar1;
  uint32_t uVar2;
  ulong uVar3;
  uint local_54;
  uint local_50;
  uint32_t temp;
  uint32_t i_mod_nk;
  uint32_t i_div_nk;
  uint32_t *w;
  size_t n;
  size_t nk;
  size_t nb;
  size_t i;
  size_t nkey_local;
  uint8_t *key_local;
  cf_aes_context *ctx_local;
  
  uVar3 = nkey >> 2;
  uVar1 = ctx->rounds;
  for (nb = 0; nb < uVar3; nb = nb + 1) {
    uVar2 = read32_be(key + nb * 4);
    ctx->ks[nb] = uVar2;
  }
  temp = 1;
  local_50 = 0;
  for (; nb < (ulong)(uVar1 + 1) * 4; nb = nb + 1) {
    local_54 = ctx->ks[nb - 1];
    if (local_50 == uVar3) {
      temp = temp + 1;
      local_50 = 0;
    }
    if (local_50 == 0) {
      uVar2 = rotl32(local_54,8);
      local_54 = sub_word(uVar2,S);
      local_54 = local_54 ^ (uint)Rcon[temp] << 0x18;
    }
    else if ((6 < uVar3) && (local_50 == 4)) {
      local_54 = sub_word(local_54,S);
    }
    ctx->ks[nb] = *(uint *)((long)ctx + (nb - uVar3) * 4 + 4) ^ local_54;
    local_50 = local_50 + 1;
  }
  return;
}

Assistant:

static void aes_schedule(cf_aes_context *ctx, const uint8_t *key, size_t nkey)
{
  size_t i,
         nb = AES_BLOCKSZ / 4,
         nk = nkey / 4,
         n = nb * (ctx->rounds + 1);
  uint32_t *w = ctx->ks;

  /* First words are just the key. */
  for (i = 0; i < nk; i++)
  {
    w[i] = read32_be(key + i * 4);
  }

  uint32_t i_div_nk = 1;
  uint32_t i_mod_nk = 0;

  for (; i < n; i++, i_mod_nk++)
  {
    uint32_t temp = w[i - 1];
    
    if (i_mod_nk == nk)
    {
      i_div_nk++;
      i_mod_nk = 0;
    }

    if (i_mod_nk == 0)
      temp = sub_word(rot_word(temp), S) ^ round_constant(i_div_nk);
    else if (nk > 6 && i_mod_nk == 4)
      temp = sub_word(temp, S);

    w[i] = w[i - nk] ^ temp;
  }
}